

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unixUnmapfile(unixFile *pFd)

{
  unixFile *pFd_local;
  
  if (pFd->pMapRegion != (void *)0x0) {
    (*aSyscall[0x17].pCurrent)(pFd->pMapRegion,pFd->mmapSizeActual);
    pFd->pMapRegion = (void *)0x0;
    pFd->mmapSize = 0;
    pFd->mmapSizeActual = 0;
  }
  return;
}

Assistant:

static void unixUnmapfile(unixFile *pFd){
  assert( pFd->nFetchOut==0 );
  if( pFd->pMapRegion ){
    osMunmap(pFd->pMapRegion, pFd->mmapSizeActual);
    pFd->pMapRegion = 0;
    pFd->mmapSize = 0;
    pFd->mmapSizeActual = 0;
  }
}